

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.cc
# Opt level: O1

string * __thiscall board::Move::getString_abi_cxx11_(string *__return_storage_ptr__,Move *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined3 in_EAX;
  size_t sVar5;
  int iVar6;
  char c [5];
  undefined8 uStack_28;
  
  uVar1 = this->value;
  iVar2 = Board::SQ64[uVar1 & 0x7f];
  iVar3 = *(int *)((long)Board::SQ64 + (ulong)(uVar1 >> 5 & 0x1fc));
  iVar6 = iVar2 + 7;
  if (-1 < iVar2) {
    iVar6 = iVar2;
  }
  iVar4 = iVar3 + 7;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  uStack_28 = (ulong)CONCAT16((char)(iVar4 >> 3) + '1',
                              CONCAT15(((char)iVar3 - ((byte)iVar4 & 0xf8)) + 'a',
                                       CONCAT14((char)(iVar6 >> 3) + '1',
                                                CONCAT13(((char)iVar2 - ((byte)iVar6 & 0xf8)) + 'a',
                                                         in_EAX))));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar5 = strlen((char *)((long)&uStack_28 + 3));
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,(char *)((long)&uStack_28 + 3),
             (long)&uStack_28 + sVar5 + 3);
  if ((uVar1 >> 0x14 & 0xf) != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string board::Move::getString() const
{
    int fromSquare = Board::SQ64[FROMSQ(value)];
    int toSquare = Board::SQ64[TOSQ(value)];
    int promoted = PROMOTED(value);
    char c[] = {static_cast<char>((fromSquare % 8) + 'a'), static_cast<char>((fromSquare / 8) + '1'),
                static_cast<char>((toSquare % 8) + 'a'), static_cast<char>((toSquare / 8) + '1'), '\0'};
    std::string str(static_cast<char*>(c));
    if (promoted) {
        char promotedChar = Board::PIECE_CHARS[promoted];
        str += promotedChar;
    }
    return str;
}